

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger thread_getstatus(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  HSQUIRRELVM v_00;
  SQRESULT SVar2;
  SQInteger unaff_retaddr;
  SQChar *in_stack_00000008;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffffd8;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  
  pSVar1 = stack_get(in_stack_ffffffffffffffe0,(SQInteger)in_stack_ffffffffffffffd8);
  v_00 = (HSQUIRRELVM)sq_getvmstate((HSQUIRRELVM)(pSVar1->super_SQObject)._unVal.pTable);
  if (v_00 == (HSQUIRRELVM)0x0) {
    sq_pushstring((HSQUIRRELVM)o,in_stack_00000008,unaff_retaddr);
  }
  else if (v_00 == (HSQUIRRELVM)0x1) {
    sq_pushstring((HSQUIRRELVM)o,in_stack_00000008,unaff_retaddr);
  }
  else {
    if (v_00 != (HSQUIRRELVM)0x2) {
      SVar2 = sq_throwerror(v_00,in_stack_ffffffffffffffd8);
      return SVar2;
    }
    sq_pushstring((HSQUIRRELVM)o,in_stack_00000008,unaff_retaddr);
  }
  return 1;
}

Assistant:

static SQInteger thread_getstatus(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,1);
    switch(sq_getvmstate(_thread(o))) {
        case SQ_VMSTATE_IDLE:
            sq_pushstring(v,_SC("idle"),-1);
        break;
        case SQ_VMSTATE_RUNNING:
            sq_pushstring(v,_SC("running"),-1);
        break;
        case SQ_VMSTATE_SUSPENDED:
            sq_pushstring(v,_SC("suspended"),-1);
        break;
        default:
            return sq_throwerror(v,_SC("internal VM error"));
    }
    return 1;
}